

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *__src;
  long lVar4;
  bool bVar5;
  
  __src = (byte *)0x0;
  lVar4 = 0;
  do {
    pbVar3 = (byte *)s;
    if (((anonymous_namespace)::chartype_table[*pbVar3] & 1) == 0) {
      if (((anonymous_namespace)::chartype_table[pbVar3[1]] & 1) != 0) {
        pbVar3 = pbVar3 + 1;
        goto LAB_00113aba;
      }
      if (((anonymous_namespace)::chartype_table[pbVar3[2]] & 1) != 0) {
        pbVar3 = pbVar3 + 2;
        goto LAB_00113aba;
      }
      bVar5 = ((anonymous_namespace)::chartype_table[pbVar3[3]] & 1) == 0;
      if (bVar5) {
        pbVar3 = pbVar3 + 4;
      }
      else {
        pbVar3 = pbVar3 + 3;
      }
    }
    else {
LAB_00113aba:
      bVar5 = false;
    }
    s = (char_t *)pbVar3;
    if (!bVar5) {
      bVar1 = *pbVar3;
      if (bVar1 == 0xd) {
        *pbVar3 = 10;
        s = (char_t *)(pbVar3 + 1);
        if (pbVar3[1] == 10) {
          if (__src != (byte *)0x0) {
            memmove(__src + -lVar4,__src,(long)(pbVar3 + 1) - (long)__src);
          }
          __src = pbVar3 + 2;
          lVar4 = lVar4 + 1;
          s = (char_t *)__src;
        }
      }
      else {
        if (bVar1 == 0) {
          pbVar2 = pbVar3;
          if (__src != (byte *)0x0) {
            memmove(__src + -lVar4,__src,(long)pbVar3 - (long)__src);
            pbVar2 = pbVar3 + -lVar4;
          }
          *pbVar2 = 0;
          return (char_t *)pbVar3;
        }
        if (bVar1 == 0x3c) {
          pbVar2 = pbVar3;
          if (__src != (byte *)0x0) {
            memmove(__src + -lVar4,__src,(long)pbVar3 - (long)__src);
            pbVar2 = pbVar3 + -lVar4;
          }
          *pbVar2 = 0;
          return (char_t *)(pbVar3 + 1);
        }
        s = (char_t *)(pbVar3 + 1);
      }
    }
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}